

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::canEnterLiteral(ClauseMatcher *this,CodeOp *op)

{
  _Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false> _Var1;
  bool bVar2;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar3
  ;
  MatchInfo **ppMVar4;
  ulong uVar5;
  ulong uVar6;
  ILStruct *this_00;
  ILStruct *targets;
  bool bVar7;
  
  this_00 = (ILStruct *)(op->_content >> 3);
  if ((this_00->timestamp == (this->tree->super_CodeTree)._curTimeStamp) &&
     (this_00->visited != false)) {
    bVar2 = false;
  }
  else {
    pRVar3 = (this->lms)._cursor;
    bVar2 = true;
    if (0x10 < (ulong)((long)pRVar3 - (long)(this->lms)._stack)) {
      if ((this_00->varCnt != 0) &&
         (_Var1._M_head_impl =
               pRVar3[-1]._self._M_t.
               super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
               _M_head_impl, (_Var1._M_head_impl)->_eagerlyMatched == false)) {
        LiteralMatcher::doEagerMatching(_Var1._M_head_impl);
      }
      pRVar3 = (this->lms)._stack;
      if ((long)(this->lms)._cursor - (long)pRVar3 != 0x10) {
        uVar6 = 0;
        do {
          _Var1._M_head_impl =
               pRVar3[uVar6]._self._M_t.
               super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
               _M_head_impl;
          targets = (ILStruct *)(**(ulong **)&(_Var1._M_head_impl)->super_Matcher >> 3);
          if ((targets->varCnt != 0) && ((_Var1._M_head_impl)->_eagerlyMatched == false)) {
            LiteralMatcher::doEagerMatching(_Var1._M_head_impl);
          }
          uVar5 = (ulong)this_00->matchCnt;
          while (uVar5 != 0) {
            uVar5 = uVar5 - 1;
            ppMVar4 = CodeTree::ILStruct::getMatch(this_00,(uint)uVar5);
            bVar2 = existsCompatibleMatch(this,this_00,*ppMVar4,targets);
            if (!bVar2) {
              CodeTree::ILStruct::deleteMatch(this_00,(uint)uVar5);
            }
          }
          bVar7 = this_00->matchCnt == 0;
          bVar2 = !bVar7;
          if (bVar7) {
            return bVar2;
          }
          uVar6 = uVar6 + 1;
          pRVar3 = (this->lms)._stack;
        } while (uVar6 < ((long)(this->lms)._cursor - (long)pRVar3 >> 4) - 1U);
      }
    }
  }
  return bVar2;
}

Assistant:

inline bool ClauseCodeTree::ClauseMatcher::canEnterLiteral(CodeOp* op)
{
  ASS(op->isLitEnd());
  ASS_EQ(lms.top()->op, op);

  ILStruct* ils=op->getILS();
  if(ils->timestamp==tree->_curTimeStamp && ils->visited) {
    return false;
  }

  if(lms.size()>1) {
    //we have already matched and entered some index literals, so we
    //will check for compatibility of variable assignments
    if(ils->varCnt && !lms.top()->eagerlyMatched()) {
      lms.top()->doEagerMatching();
      RSTAT_MST_INC("match count", lms.size()-1, lms.top()->getILS()->matchCnt);
    }
    for(size_t ilIndex=0;ilIndex<lms.size()-1;ilIndex++) {
      ILStruct* prevILS=lms[ilIndex]->getILS();
      if(prevILS->varCnt && !lms[ilIndex]->eagerlyMatched()) {
	lms[ilIndex]->doEagerMatching();
	RSTAT_MST_INC("match count", ilIndex, lms[ilIndex]->getILS()->matchCnt);
      }

      size_t matchIndex=ils->matchCnt;
      while(matchIndex!=0) {
	matchIndex--;
	MatchInfo* mi=ils->getMatch(matchIndex);
	if(!existsCompatibleMatch(ils, mi, prevILS)) {
	  ils->deleteMatch(matchIndex); //decreases ils->matchCnt
	}
      }
      if(!ils->matchCnt) {
	return false;
      }
    }
  }

  return true;
}